

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

void google::protobuf::FileDescriptorTables::BuildLocationsByPath
               (pair<const_google::protobuf::FileDescriptorTables_*,_const_google::protobuf::SourceCodeInfo_*>
                *p)

{
  FileDescriptorTables *pFVar1;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::SourceCodeInfo_Location>_>
  *pVVar2;
  MappedReference<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char>,_const_google::protobuf::SourceCodeInfo_Location_*>_>
  ppSVar3;
  int index;
  char *in_R8;
  int iVar4;
  string_view separator;
  string local_50;
  
  iVar4 = *(int *)((long)&p->second->field_0 + 0x20);
  index = 0;
  if (iVar4 < 1) {
    iVar4 = 0;
  }
  for (; iVar4 != index; index = index + 1) {
    pVVar2 = internal::RepeatedPtrFieldBase::
             Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::SourceCodeInfo_Location>>
                       (&(p->second->field_0)._impl_.location_.super_RepeatedPtrFieldBase,index);
    pFVar1 = p->first;
    separator._M_str = in_R8;
    separator._M_len = (size_t)",";
    absl::lts_20240722::strings_internal::JoinRange<google::protobuf::RepeatedField<int>>
              (&local_50,(strings_internal *)&(pVVar2->field_0)._impl_.path_,
               (RepeatedField<int> *)0x1,separator);
    ppSVar3 = absl::lts_20240722::container_internal::
              raw_hash_map<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::SourceCodeInfo_Location_*>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::SourceCodeInfo_Location_*>_>_>
              ::
              operator[]<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::SourceCodeInfo_Location_*>,_nullptr>
                        (&(pFVar1->locations_by_path_).
                          super_raw_hash_map<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::SourceCodeInfo_Location_*>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::SourceCodeInfo_Location_*>_>_>
                         ,&local_50);
    *ppSVar3 = pVVar2;
    std::__cxx11::string::~string((string *)&local_50);
  }
  return;
}

Assistant:

void FileDescriptorTables::BuildLocationsByPath(
    std::pair<const FileDescriptorTables*, const SourceCodeInfo*>* p) {
  for (int i = 0, len = p->second->location_size(); i < len; ++i) {
    const SourceCodeInfo_Location* loc = &p->second->location().Get(i);
    p->first->locations_by_path_[absl::StrJoin(loc->path(), ",")] = loc;
  }
}